

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

int ON_ComparePointList(int dim,bool is_rat,int point_count,int point_strideA,double *pointA,
                       int point_strideB,double *pointB)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double B [3];
  double A [3];
  double local_78 [4];
  double local_58 [3];
  long local_40;
  long local_38;
  
  lVar10 = (long)dim;
  local_40 = lVar10;
  if ((point_count < 1 || 3 < dim) || !is_rat) {
    bVar6 = true;
    if (point_count < 1) {
      return 0;
    }
  }
  else {
    bVar3 = ON_IsValid(pointA[lVar10]);
    bVar6 = true;
    if ((bVar3) &&
       (((pointA[lVar10] != 0.0 || (NAN(pointA[lVar10]))) &&
        (bVar3 = ON_IsValid(pointB[lVar10]), bVar3)))) {
      bVar6 = pointB[lVar10] == 0.0;
    }
  }
  local_58[2] = 0.0;
  local_58[1] = 0.0;
  local_58[0] = 0.0;
  local_78[2] = 0.0;
  local_78[1] = 0.0;
  local_78[0] = 0.0;
  local_38 = (long)point_strideA << 3;
  iVar7 = 0;
  iVar9 = 0;
  while( true ) {
    iVar4 = ON_ComparePoint(dim,is_rat,pointA,pointB);
    if (iVar4 != 0 && !bVar6) {
      dVar1 = pointA[local_40];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar2 = pointB[local_40];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          if (iVar7 == 0) {
            iVar7 = iVar4;
          }
          iVar5 = 0;
          iVar4 = iVar5;
          if (0 < dim) {
            uVar8 = 0;
            do {
              local_58[uVar8] = pointA[uVar8] / dVar1;
              local_78[uVar8] = pointB[uVar8] / dVar2;
              uVar8 = uVar8 + 1;
            } while ((uint)dim != uVar8);
            if (0 < dim) {
              lVar10 = 0;
              do {
                dVar1 = local_58[lVar10];
                dVar2 = local_78[lVar10];
                dVar12 = (ABS(dVar2) + ABS(dVar1)) * 2.2737367544323206e-13;
                dVar11 = 2.3283064365386963e-10;
                if (2.3283064365386963e-10 <= dVar12) {
                  dVar11 = dVar12;
                }
                iVar4 = iVar7;
              } while (((dVar2 - dVar11 <= dVar1) && (dVar1 - dVar11 <= dVar2)) &&
                      (lVar10 = lVar10 + 1, iVar4 = iVar5, dim != (int)lVar10));
            }
          }
        }
      }
    }
    iVar9 = iVar9 + 1;
    if (point_count <= iVar9) break;
    pointA = (double *)((long)pointA + local_38);
    pointB = pointB + point_strideB;
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

int 
ON_ComparePointList( // returns 
                              // -1: first < second
                              //  0: first == second
                              // +1: first > second
          int dim,
          bool is_rat,
          int point_count,
          int point_strideA,
          const double* pointA,
          int point_strideB,
          const double* pointB
          )
{
  int i, rc = 0, rc1 = 0;
  const bool bDoSecondCheck = ( 1 == is_rat && dim <= 3 && point_count > 0 
                         && ON_IsValid(pointA[dim]) && 0.0 != pointA[dim]
                         && ON_IsValid(pointB[dim]) && 0.0 != pointB[dim]
                         );
  double A[3] = {0.0,0.0,0.0};
  double B[3] = {0.0,0.0,0.0};
  //const size_t AB_size = dim*sizeof(A[0]);

  for ( i = 0; i < point_count && !rc; i++ ) 
  {
    rc = ON_ComparePoint( dim, is_rat, pointA, pointB );
    if (    rc && bDoSecondCheck 
      && 0.0 != pointA[dim] && 0.0 != pointB[dim]
      )
    {
      if ( !rc1 )
        rc1 = rc;
      // bDoSecondCheck = true ensures is_rat is true and pointX[dim] != 0.0
      for(int k = 0; k < dim; k++) 
      {
        A[k] = pointA[k]/pointA[dim];      
        B[k] = pointB[k]/pointB[dim];
      }
      rc = ( 0 == ON_ComparePoint( dim, 0, A, B ) ) ? 0 : rc1;
    }
    pointA += point_strideA;
    pointB += point_strideB;
  }

  return rc;
}